

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QBrush>::emplace<QBrush_const&>
          (QMovableArrayOps<QBrush> *this,qsizetype i,QBrush *args)

{
  QBrush **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter IStack_58;
  QBrush tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QBrush>).super_QArrayDataPointer<QBrush>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QBrush>).super_QArrayDataPointer<QBrush>.size == i) {
      qVar5 = QArrayDataPointer<QBrush>::freeSpaceAtEnd((QArrayDataPointer<QBrush> *)this);
      if (qVar5 == 0) goto LAB_00289944;
      QBrush::QBrush((this->super_QGenericArrayOps<QBrush>).super_QArrayDataPointer<QBrush>.ptr +
                     (this->super_QGenericArrayOps<QBrush>).super_QArrayDataPointer<QBrush>.size,
                     args);
LAB_00289a29:
      pqVar2 = &(this->super_QGenericArrayOps<QBrush>).super_QArrayDataPointer<QBrush>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_002899e8;
    }
LAB_00289944:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QBrush>::freeSpaceAtBegin((QArrayDataPointer<QBrush> *)this);
      if (qVar5 != 0) {
        QBrush::QBrush((this->super_QGenericArrayOps<QBrush>).super_QArrayDataPointer<QBrush>.ptr +
                       -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QBrush>).super_QArrayDataPointer<QBrush>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_00289a29;
      }
    }
  }
  tmp.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QBrush>).super_QArrayDataPointer<QBrush>.size != 0;
  QArrayDataPointer<QBrush>::detachAndGrow
            ((QArrayDataPointer<QBrush> *)this,(uint)(i == 0 && bVar6),1,(QBrush **)0x0,
             (QArrayDataPointer<QBrush> *)0x0);
  if (i == 0 && bVar6) {
    QBrush::QBrush((this->super_QGenericArrayOps<QBrush>).super_QArrayDataPointer<QBrush>.ptr + -1,
                   &tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QBrush>).super_QArrayDataPointer<QBrush>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QBrush>).super_QArrayDataPointer<QBrush>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QBrush> *)this,i,1);
    QBrush::QBrush(IStack_58.displaceFrom,&tmp);
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QBrush::~QBrush(&tmp);
LAB_002899e8:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }